

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ary_heap.hpp
# Opt level: O1

void __thiscall
boost::
d_ary_heap_indirect<unsigned_long,_4UL,_boost::iterator_property_map<unsigned_long_*,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>,_std::less<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
::preserve_heap_property_up
          (d_ary_heap_indirect<unsigned_long,_4UL,_boost::iterator_property_map<unsigned_long_*,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>,_std::less<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *this,size_type index)

{
  double dVar1;
  double dVar2;
  pointer puVar3;
  double *pdVar4;
  unsigned_long uVar5;
  unsigned_long *puVar6;
  unsigned_long uVar7;
  long lVar8;
  size_type orig_index;
  size_type sVar9;
  
  if (index != 0) {
    puVar3 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->distance).iter._M_current;
    uVar5 = puVar3[index];
    dVar1 = pdVar4[uVar5];
    lVar8 = -1;
    sVar9 = index;
    do {
      if (sVar9 == 0) {
        lVar8 = lVar8 + 1;
        goto LAB_004bf4a8;
      }
      sVar9 = sVar9 - 1 >> 2;
      dVar2 = pdVar4[puVar3[sVar9]];
      lVar8 = lVar8 + 1;
    } while (dVar1 < dVar2);
    lVar8 = lVar8 + (ulong)(dVar1 < dVar2);
LAB_004bf4a8:
    if (lVar8 != 0) {
      puVar6 = (this->index_in_heap).iter;
      sVar9 = index;
      do {
        index = sVar9 - 1 >> 2;
        uVar7 = puVar3[index];
        puVar6[uVar7] = sVar9;
        puVar3[sVar9] = uVar7;
        lVar8 = lVar8 + -1;
        sVar9 = index;
      } while (lVar8 != 0);
    }
    puVar3[index] = uVar5;
    (this->index_in_heap).iter[uVar5] = index;
  }
  return;
}

Assistant:

void preserve_heap_property_up(size_type index) {
      size_type orig_index = index;
      size_type num_levels_moved = 0;
      // The first loop just saves swaps that need to be done in order to avoid
      // aliasing issues in its search; there is a second loop that does the
      // necessary swap operations
      if (index == 0) return; // Do nothing on root
      Value currently_being_moved = data[index];
      distance_type currently_being_moved_dist =
        get(distance, currently_being_moved);
      for (;;) {
        if (index == 0) break; // Stop at root
        size_type parent_index = parent(index);
        Value parent_value = data[parent_index];
        if (compare(currently_being_moved_dist, get(distance, parent_value))) {
          ++num_levels_moved;
          index = parent_index;
          continue;
        } else {
          break; // Heap property satisfied
        }
      }
      // Actually do the moves -- move num_levels_moved elements down in the
      // tree, then put currently_being_moved at the top
      index = orig_index;
      for (size_type i = 0; i < num_levels_moved; ++i) {
        size_type parent_index = parent(index);
        Value parent_value = data[parent_index];
        put(index_in_heap, parent_value, index);
        data[index] = parent_value;
        index = parent_index;
      }
      data[index] = currently_being_moved;
      put(index_in_heap, currently_being_moved, index);
      verify_heap();
    }